

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp6.c
# Opt level: O1

void unget(Global *global)

{
  FILEINFO *pFVar1;
  char *pcVar2;
  
  pFVar1 = global->infile;
  if (pFVar1 != (FILEINFO *)0x0) {
    pcVar2 = pFVar1->bptr + -1;
    pFVar1->bptr = pcVar2;
    if (pcVar2 < pFVar1->buffer) {
      cerror(global,FATAL_TOO_MUCH_PUSHBACK);
      return;
    }
    if (*pcVar2 == '\n') {
      global->line = global->line + -1;
    }
  }
  return;
}

Assistant:

void unget(struct Global *global)
{
  /*
   * Backup the pointer to reread the last character.  Fatal error
   * (code bug) if we backup too far.  unget() may be called,
   * without problems, at end of file.  Only one character may
   * be ungotten.  If you need to unget more, call ungetstring().
   */
 
  FILEINFO *file;
  if ((file = global->infile) == NULL)
    return;			/* Unget after EOF	      */
  if (--file->bptr < file->buffer) {
    cfatal(global, FATAL_TOO_MUCH_PUSHBACK);
    /* This happens only if used the wrong way! */
    return;
  }
  if (*file->bptr == '\n')        	/* Ungetting a newline?       */
    --global->line;			/* Unget the line number, too */
}